

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O3

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
          (GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *this)

{
  GLuint local_c;
  
  local_c = this->m_uiHandle;
  if (local_c != 0) {
    if ((this->m_CreateReleaseHelper).m_ExternalFBOHandle == 0) {
      (*__glewDeleteFramebuffers)(1,&local_c);
    }
    else {
      (this->m_CreateReleaseHelper).m_ExternalFBOHandle = 0;
    }
    this->m_uiHandle = 0;
  }
  return;
}

Assistant:

void Release()
    {
        if (m_uiHandle)
        {
            m_CreateReleaseHelper.Release(m_uiHandle);
            m_uiHandle = 0;
        }
    }